

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void FTransformPass2_SSE2(__m128i *v01,__m128i *v32,int16_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  short sVar12;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m128i a01;
  __m128i g1;
  __m128i f3;
  __m128i f1;
  __m128i e3;
  __m128i e1;
  __m128i d3;
  __m128i d1;
  __m128i c3;
  __m128i c1;
  __m128i b23;
  __m128i a22;
  __m128i a32;
  __m128i k51000;
  __m128i k12000_plus_one;
  __m128i k2217_5352;
  __m128i k5352_2217;
  __m128i seven;
  __m128i zero;
  undefined8 local_588;
  undefined8 local_578;
  undefined8 local_548;
  undefined8 local_508;
  undefined8 local_478;
  short local_388;
  short sStack_386;
  short sStack_384;
  short sStack_382;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined4 uStack_f0;
  __m128i d2_f3;
  __m128i d0_g1;
  __m128i d2;
  __m128i d0;
  __m128i c2;
  __m128i c0;
  __m128i a11;
  __m128i a01_plus_7;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  local_388 = (short)uVar1;
  sStack_386 = (short)((ulong)uVar1 >> 0x10);
  sStack_384 = (short)((ulong)uVar1 >> 0x20);
  sStack_382 = (short)((ulong)uVar1 >> 0x30);
  local_388 = local_388 - (short)uVar2;
  sStack_386 = sStack_386 - (short)((ulong)uVar2 >> 0x10);
  sStack_384 = sStack_384 - (short)((ulong)uVar2 >> 0x20);
  sStack_382 = sStack_382 - (short)((ulong)uVar2 >> 0x30);
  local_188 = (undefined2)local_478;
  uStack_186 = (undefined2)((ulong)local_478 >> 0x10);
  uStack_184 = (undefined2)((ulong)local_478 >> 0x20);
  uStack_182 = (undefined2)((ulong)local_478 >> 0x30);
  auVar11._2_2_ = local_388;
  auVar11._0_2_ = local_188;
  auVar11._4_2_ = uStack_186;
  auVar11._6_2_ = sStack_386;
  auVar11._10_2_ = sStack_384;
  auVar11._8_2_ = uStack_184;
  auVar11._12_2_ = uStack_182;
  auVar11._14_2_ = sStack_382;
  auVar10._8_8_ = 0x14e808a914e808a9;
  auVar10._0_8_ = 0x14e808a914e808a9;
  auVar13 = pmaddwd(auVar11,auVar10);
  auVar9._2_2_ = local_388;
  auVar9._0_2_ = local_188;
  auVar9._4_2_ = uStack_186;
  auVar9._6_2_ = sStack_386;
  auVar9._10_2_ = sStack_384;
  auVar9._8_2_ = uStack_184;
  auVar9._12_2_ = uStack_182;
  auVar9._14_2_ = sStack_382;
  auVar8._8_8_ = 0x8a9eb1808a9eb18;
  auVar8._0_8_ = 0x8a9eb1808a9eb18;
  auVar14 = pmaddwd(auVar9,auVar8);
  local_268 = auVar13._0_4_;
  iStack_264 = auVar13._4_4_;
  iStack_260 = auVar13._8_4_;
  iStack_25c = auVar13._12_4_;
  local_288 = auVar14._0_4_;
  iStack_284 = auVar14._4_4_;
  iStack_280 = auVar14._8_4_;
  iStack_27c = auVar14._12_4_;
  auVar13 = ZEXT416(0x10);
  auVar14 = ZEXT416(0x10);
  uVar1 = CONCAT44(iStack_264 + 0x12ee0 >> auVar13,local_268 + 0x12ee0 >> auVar13);
  uVar2 = CONCAT44(iStack_25c + 0x12ee0 >> auVar13,iStack_260 + 0x12ee0 >> auVar13);
  auVar7._8_8_ = uVar2;
  auVar7._0_8_ = uVar1;
  auVar6._8_8_ = uVar2;
  auVar6._0_8_ = uVar1;
  auVar13 = packssdw(auVar7,auVar6);
  uVar1 = CONCAT44(iStack_284 + 51000 >> auVar14,local_288 + 51000 >> auVar14);
  uVar2 = CONCAT44(iStack_27c + 51000 >> auVar14,iStack_280 + 51000 >> auVar14);
  auVar5._8_8_ = uVar2;
  auVar5._0_8_ = uVar1;
  auVar15._8_8_ = uVar2;
  auVar15._0_8_ = uVar1;
  auVar15 = packssdw(auVar5,auVar15);
  local_1e8 = auVar13._0_2_;
  sStack_1e6 = auVar13._2_2_;
  sStack_1e4 = auVar13._4_2_;
  sStack_1e2 = auVar13._6_2_;
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = *in_RSI;
  uVar4 = in_RSI[1];
  local_208 = (short)uVar1;
  sStack_206 = (short)((ulong)uVar1 >> 0x10);
  sStack_204 = (short)((ulong)uVar1 >> 0x20);
  sStack_202 = (short)((ulong)uVar1 >> 0x30);
  sStack_200 = (short)uVar2;
  sStack_1fe = (short)((ulong)uVar2 >> 0x10);
  sStack_1fc = (short)((ulong)uVar2 >> 0x20);
  sStack_1fa = (short)((ulong)uVar2 >> 0x30);
  local_218 = (short)uVar3;
  sStack_216 = (short)((ulong)uVar3 >> 0x10);
  sStack_214 = (short)((ulong)uVar3 >> 0x20);
  sStack_212 = (short)((ulong)uVar3 >> 0x30);
  sStack_210 = (short)uVar4;
  sStack_20e = (short)((ulong)uVar4 >> 0x10);
  sStack_20c = (short)((ulong)uVar4 >> 0x20);
  sStack_20a = (short)((ulong)uVar4 >> 0x30);
  sStack_1fc = sStack_1fc + sStack_20c;
  sStack_1fa = sStack_1fa + sStack_20a;
  sVar12 = local_208 + local_218 + 7;
  sVar16 = sStack_206 + sStack_216 + 7;
  sVar17 = sStack_204 + sStack_214 + 7;
  sVar18 = sStack_202 + sStack_212 + 7;
  sVar19 = sStack_200 + sStack_210 + 7;
  sVar20 = sStack_1fe + sStack_20e + 7;
  local_258 = (short)local_548;
  sStack_256 = (short)((ulong)local_548 >> 0x10);
  sStack_254 = (short)((ulong)local_548 >> 0x20);
  sStack_252 = (short)((ulong)local_548 >> 0x30);
  sStack_250 = (short)uStack_f0;
  sStack_24e = (short)((uint)uStack_f0 >> 0x10);
  auVar14._2_2_ = sVar16 + sStack_256;
  auVar14._0_2_ = sVar12 + local_258;
  auVar14._4_2_ = sVar17 + sStack_254;
  auVar14._6_2_ = sVar18 + sStack_252;
  auVar14._10_2_ = sVar20 + sStack_24e;
  auVar14._8_2_ = sVar19 + sStack_250;
  auVar14._12_2_ = sStack_1fc + 7 + sStack_1fc;
  auVar14._14_2_ = sStack_1fa + 7 + sStack_1fa;
  auVar14 = psraw(auVar14,ZEXT416(4));
  auVar13._2_2_ = sVar16 - sStack_256;
  auVar13._0_2_ = sVar12 - local_258;
  auVar13._4_2_ = sVar17 - sStack_254;
  auVar13._6_2_ = sVar18 - sStack_252;
  auVar13._10_2_ = sVar20 - sStack_24e;
  auVar13._8_2_ = sVar19 - sStack_250;
  auVar13._12_2_ = (sStack_1fc + 7) - sStack_1fc;
  auVar13._14_2_ = (sStack_1fa + 7) - sStack_1fa;
  auVar13 = psraw(auVar13,ZEXT416(4));
  local_578 = auVar14._0_8_;
  local_588 = auVar13._0_8_;
  local_508 = auVar15._0_8_;
  *in_RDX = local_578;
  in_RDX[1] = CONCAT26(sStack_1e2 - (ushort)(sStack_382 == 0),
                       CONCAT24(sStack_1e4 - (ushort)(sStack_384 == 0),
                                CONCAT22(sStack_1e6 - (ushort)(sStack_386 == 0),
                                         local_1e8 - (ushort)(local_388 == 0))));
  in_RDX[2] = local_588;
  in_RDX[3] = local_508;
  return;
}

Assistant:

static void FTransformPass2_SSE2(const __m128i* const v01,
                                 const __m128i* const v32,
                                 int16_t* WEBP_RESTRICT out) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i seven = _mm_set1_epi16(7);
  const __m128i k5352_2217 = _mm_set_epi16(5352,  2217, 5352,  2217,
                                           5352,  2217, 5352,  2217);
  const __m128i k2217_5352 = _mm_set_epi16(2217, -5352, 2217, -5352,
                                           2217, -5352, 2217, -5352);
  const __m128i k12000_plus_one = _mm_set1_epi32(12000 + (1 << 16));
  const __m128i k51000 = _mm_set1_epi32(51000);

  // Same operations are done on the (0,3) and (1,2) pairs.
  // a3 = v0 - v3
  // a2 = v1 - v2
  const __m128i a32 = _mm_sub_epi16(*v01, *v32);
  const __m128i a22 = _mm_unpackhi_epi64(a32, a32);

  const __m128i b23 = _mm_unpacklo_epi16(a22, a32);
  const __m128i c1 = _mm_madd_epi16(b23, k5352_2217);
  const __m128i c3 = _mm_madd_epi16(b23, k2217_5352);
  const __m128i d1 = _mm_add_epi32(c1, k12000_plus_one);
  const __m128i d3 = _mm_add_epi32(c3, k51000);
  const __m128i e1 = _mm_srai_epi32(d1, 16);
  const __m128i e3 = _mm_srai_epi32(d3, 16);
  // f1 = ((b3 * 5352 + b2 * 2217 + 12000) >> 16)
  // f3 = ((b3 * 2217 - b2 * 5352 + 51000) >> 16)
  const __m128i f1 = _mm_packs_epi32(e1, e1);
  const __m128i f3 = _mm_packs_epi32(e3, e3);
  // g1 = f1 + (a3 != 0);
  // The compare will return (0xffff, 0) for (==0, !=0). To turn that into the
  // desired (0, 1), we add one earlier through k12000_plus_one.
  // -> g1 = f1 + 1 - (a3 == 0)
  const __m128i g1 = _mm_add_epi16(f1, _mm_cmpeq_epi16(a32, zero));

  // a0 = v0 + v3
  // a1 = v1 + v2
  const __m128i a01 = _mm_add_epi16(*v01, *v32);
  const __m128i a01_plus_7 = _mm_add_epi16(a01, seven);
  const __m128i a11 = _mm_unpackhi_epi64(a01, a01);
  const __m128i c0 = _mm_add_epi16(a01_plus_7, a11);
  const __m128i c2 = _mm_sub_epi16(a01_plus_7, a11);
  // d0 = (a0 + a1 + 7) >> 4;
  // d2 = (a0 - a1 + 7) >> 4;
  const __m128i d0 = _mm_srai_epi16(c0, 4);
  const __m128i d2 = _mm_srai_epi16(c2, 4);

  const __m128i d0_g1 = _mm_unpacklo_epi64(d0, g1);
  const __m128i d2_f3 = _mm_unpacklo_epi64(d2, f3);
  _mm_storeu_si128((__m128i*)&out[0], d0_g1);
  _mm_storeu_si128((__m128i*)&out[8], d2_f3);
}